

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O2

void __thiscall Group::~Group(Group *this)

{
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Group_0013aa10;
  std::_Vector_base<Object3D_*,_std::allocator<Object3D_*>_>::~_Vector_base
            (&(this->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>);
  Object3D::~Object3D(&this->super_Object3D);
  return;
}

Assistant:

virtual ~Group() {}